

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O3

void __thiscall
wasm::(anonymous_namespace)::AsyncifyAssertInNonInstrumented::addAssertsInNonInstrumented(wasm::
Function*)::Walker::handleCall(wasm::Expression__(void *this,Expression *call)

{
  undefined4 uVar1;
  long *plVar2;
  uintptr_t uVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined8 *puVar7;
  Index index;
  Expression *pEVar8;
  Expression *pEVar9;
  Binary *this_00;
  If *this_01;
  Block *pBVar10;
  const_iterator cVar11;
  iterator iVar12;
  mapped_type *pmVar13;
  undefined8 *puVar14;
  ulong extraout_RDX;
  ulong uVar15;
  Type in_R8;
  _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_02;
  optional<wasm::Type> type;
  optional<wasm::Type> type_;
  optional<wasm::Type> type_00;
  LocalSet *local_80;
  If *local_78;
  undefined1 *local_70;
  initializer_list<wasm::Expression_*> local_68;
  Expression *local_58;
  Builder *local_50;
  undefined8 *local_48;
  uintptr_t uStack_40;
  
  plVar2 = *(long **)((long)this + 0xe0);
  local_48 = (undefined8 *)ASYNCIFY_STATE;
  uStack_40 = DAT_010b1908;
  local_58 = call;
  pEVar8 = (Expression *)MixedArena::allocSpace((MixedArena *)(*plVar2 + 0x200),0x20,8);
  pEVar8->_id = GlobalGetId;
  *(undefined8 **)(pEVar8 + 1) = local_48;
  pEVar8[1].type.id = uStack_40;
  (pEVar8->type).id = 2;
  uVar1 = *(undefined4 *)((long)this + 0xe8);
  pEVar9 = (Expression *)
           MixedArena::allocSpace((MixedArena *)(**(long **)((long)this + 0xe0) + 0x200),0x18,8);
  pEVar9->_id = LocalGetId;
  *(undefined4 *)(pEVar9 + 1) = uVar1;
  (pEVar9->type).id = 2;
  this_00 = (Binary *)MixedArena::allocSpace((MixedArena *)(*plVar2 + 0x200),0x28,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  this_00->op = NeInt32;
  this_00->left = pEVar8;
  this_00->right = pEVar9;
  Binary::finalize(this_00);
  local_48 = (undefined8 *)this;
  pEVar9 = (Expression *)
           MixedArena::allocSpace((MixedArena *)(**(long **)((long)this + 0xe0) + 0x200),0x10,8);
  pEVar9->_id = UnreachableId;
  (pEVar9->type).id = 1;
  uVar15 = 0x28;
  this_01 = (If *)MixedArena::allocSpace((MixedArena *)(*plVar2 + 0x200),0x28,8);
  pEVar8 = local_58;
  (this_01->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression._id = IfId;
  (this_01->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id = 0;
  this_01->condition = (Expression *)this_00;
  this_01->ifTrue = pEVar9;
  this_01->ifFalse = (Expression *)0x0;
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar15;
  If::finalize(this_01,type_);
  puVar7 = local_48;
  uVar15 = (pEVar8->type).id;
  if (uVar15 < 2) {
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar15;
    pBVar10 = Builder::makeSequence((Builder *)local_48[0x1c],pEVar8,(Expression *)this_01,type_00);
  }
  else {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar15;
    index = Builder::addVar((Builder *)local_48[0x1b],(Function *)0x0,(Name)(auVar5 << 0x40),in_R8);
    local_50 = (Builder *)puVar7[0x1c];
    local_80 = Builder::makeLocalSet(local_50,index,pEVar8);
    uVar3 = (pEVar8->type).id;
    local_78 = this_01;
    local_70 = (undefined1 *)
               MixedArena::allocSpace((MixedArena *)(*(long *)puVar7[0x1c] + 0x200),0x18,8);
    *local_70 = 8;
    *(Index *)(local_70 + 0x10) = index;
    *(uintptr_t *)(local_70 + 8) = uVar3;
    local_68._M_len = 3;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)extraout_RDX;
    local_68._M_array = (iterator)&local_80;
    pBVar10 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                        (local_50,&local_68,type);
  }
  puVar14 = (undefined8 *)*puVar7;
  lVar4 = puVar7[0x19];
  if (lVar4 != 0) {
    local_80 = (LocalSet *)*puVar14;
    if (*(long *)(lVar4 + 0xf0) != 0) {
      this_02 = (_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)(lVar4 + 0xd8);
      local_68._M_array = (iterator)pBVar10;
      cVar11 = std::
               _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(this_02,(key_type *)&local_68);
      if (cVar11.
          super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
          ._M_cur == (__node_type *)0x0) {
        iVar12 = std::
                 _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(this_02,(key_type *)&local_80);
        if (iVar12.
            super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
            ._M_cur != (__node_type *)0x0) {
          pmVar13 = std::__detail::
                    _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)this_02,(key_type *)&local_68);
          uVar6 = *(undefined8 *)
                   ((long)iVar12.
                          super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
                          ._M_cur + 0x18);
          *(undefined8 *)
           &(pmVar13->super__Optional_base<wasm::Function::DebugLocation,_true,_true>)._M_payload.
            super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload =
               *(undefined8 *)
                ((long)iVar12.
                       super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
                       ._M_cur + 0x10);
          *(undefined8 *)
           ((long)&(pmVar13->super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
                   _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload
           + 8) = uVar6;
          *(undefined8 *)
           ((long)&(pmVar13->super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
                   _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload
                   ._M_value.symbolNameIndex.super__Optional_base<unsigned_int,_true,_true>.
                   _M_payload + 4) =
               *(undefined8 *)
                ((long)iVar12.
                       super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
                       ._M_cur + 0x20);
        }
      }
    }
    puVar14 = (undefined8 *)*puVar7;
  }
  *puVar14 = pBVar10;
  return;
}

Assistant:

void handleCall(Expression* call) {
        auto* check = builder->makeIf(
          builder->makeBinary(NeInt32,
                              builder->makeGlobalGet(ASYNCIFY_STATE, Type::i32),
                              builder->makeLocalGet(oldState, Type::i32)),
          builder->makeUnreachable());
        Expression* rep;
        if (call->type.isConcrete()) {
          auto temp = builder->addVar(func, call->type);
          rep = builder->makeBlock({
            builder->makeLocalSet(temp, call),
            check,
            builder->makeLocalGet(temp, call->type),
          });
        } else {
          rep = builder->makeSequence(call, check);
        }
        replaceCurrent(rep);
      }